

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O2

bool __thiscall
pybind11::detail::
argument_loader<pybind11::detail::value_and_holder&,long,long,Eigen::Matrix<double,-1,1,0,-1,1>,Eigen::Matrix<double,-1,1,0,-1,1>,std::vector<std::pair<Eigen::Matrix<double,1,2,1,1,2>,double>,std::allocator<std::pair<Eigen::Matrix<double,1,2,1,1,2>,double>>>>
::load_impl_sequence<0ul,1ul,2ul,3ul,4ul,5ul>
          (argument_loader<pybind11::detail::value_and_holder&,long,long,Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>,std::vector<std::pair<Eigen::Matrix<double,1,2,1,1,2>,double>,std::allocator<std::pair<Eigen::Matrix<double,1,2,1,1,2>,double>>>>
           *this,long call)

{
  vector<bool,_std::allocator<bool>_> *this_00;
  undefined8 uVar1;
  handle hVar2;
  long lVar3;
  bool bVar4;
  undefined8 in_RAX;
  long lVar5;
  reference rVar6;
  undefined8 uStack_38;
  
  uVar1 = **(undefined8 **)(call + 8);
  this_00 = (vector<bool,_std::allocator<bool>_> *)(call + 0x20);
  uStack_38 = in_RAX;
  std::vector<bool,_std::allocator<bool>_>::operator[](this_00,0);
  *(undefined8 *)(this + 0x48) = uVar1;
  uStack_38._0_3_ = CONCAT12(1,(undefined2)uStack_38);
  hVar2.m_ptr = *(PyObject **)(*(long *)(call + 8) + 8);
  rVar6 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,1);
  bVar4 = type_caster<long,_void>::load
                    ((type_caster<long,_void> *)(this + 0x40),hVar2,
                     (*rVar6._M_p & rVar6._M_mask) != 0);
  uStack_38._0_4_ = CONCAT13(bVar4,(undefined3)uStack_38);
  hVar2.m_ptr = *(PyObject **)(*(long *)(call + 8) + 0x10);
  rVar6 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,2);
  bVar4 = type_caster<long,_void>::load
                    ((type_caster<long,_void> *)(this + 0x38),hVar2,
                     (*rVar6._M_p & rVar6._M_mask) != 0);
  uStack_38._0_5_ = CONCAT14(bVar4,(undefined4)uStack_38);
  hVar2.m_ptr = *(PyObject **)(*(long *)(call + 8) + 0x18);
  rVar6 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,3);
  bVar4 = type_caster<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_void>::load
                    ((type_caster<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_void> *)(this + 0x28),
                     hVar2,(*rVar6._M_p & rVar6._M_mask) != 0);
  uStack_38._0_6_ = CONCAT15(bVar4,(undefined5)uStack_38);
  hVar2.m_ptr = *(PyObject **)(*(long *)(call + 8) + 0x20);
  rVar6 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,4);
  bVar4 = type_caster<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_void>::load
                    ((type_caster<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_void> *)(this + 0x18),
                     hVar2,(*rVar6._M_p & rVar6._M_mask) != 0);
  uStack_38._0_7_ = CONCAT16(bVar4,(undefined6)uStack_38);
  hVar2.m_ptr = *(PyObject **)(*(long *)(call + 8) + 0x28);
  rVar6 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,5);
  list_caster<std::vector<std::pair<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_double>,_std::allocator<std::pair<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_double>_>_>,_std::pair<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_double>_>
  ::load((list_caster<std::vector<std::pair<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_double>,_std::allocator<std::pair<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_double>_>_>,_std::pair<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_double>_>
          *)this,hVar2,(*rVar6._M_p & rVar6._M_mask) != 0);
  lVar3 = 0;
  do {
    lVar5 = lVar3;
    if (lVar5 == 6) break;
    lVar3 = lVar5 + 1;
  } while (*(char *)((long)&uStack_38 + lVar5 + 2) != '\0');
  return lVar5 == 6;
}

Assistant:

bool load_impl_sequence(function_call &call, index_sequence<Is...>) {
        for (bool r : {std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])...})
            if (!r)
                return false;
        return true;
    }